

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_api.c
# Opt level: O2

MPP_RET hal_vp8d_init(void *hal,MppHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  code *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  
  if (hal == (void *)0x0) {
    return MPP_ERR_VALUE;
  }
  mpp_env_get_u32("hal_vp8d_debug",&hal_vp8d_debug,0);
  memset(hal,0,0xb0);
  RVar1 = mpp_get_vcodec_type();
  uVar3 = 4;
  if ((RVar1 & 2) == 0) {
    uVar3 = RVar1 * 2 & 2;
  }
  if (uVar3 == 4) {
    pcVar4 = hal_vp8d_vdpu2_wait;
    pcVar5 = hal_vp8d_vdpu2_start;
    pcVar6 = hal_vp8d_vdpu2_gen_regs;
    pcVar7 = hal_vp8d_vdpu2_deinit;
    UNRECOVERED_JUMPTABLE = hal_vp8d_vdpu2_init;
  }
  else {
    if (uVar3 != 2) {
      return MPP_ERR_INIT;
    }
    pcVar4 = hal_vp8d_vdpu1_wait;
    pcVar5 = hal_vp8d_vdpu1_start;
    pcVar6 = hal_vp8d_vdpu1_gen_regs;
    pcVar7 = hal_vp8d_vdpu1_deinit;
    UNRECOVERED_JUMPTABLE = hal_vp8d_vdpu1_init;
  }
  *(code **)((long)hal + 0x70) = UNRECOVERED_JUMPTABLE;
  *(code **)((long)hal + 0x78) = pcVar7;
  *(code **)((long)hal + 0x80) = pcVar6;
  *(code **)((long)hal + 0x88) = pcVar5;
  *(code **)((long)hal + 0x90) = pcVar4;
  *(undefined8 *)((long)hal + 0xa8) = 0;
  *(undefined8 *)((long)hal + 0x98) = 0;
  *(undefined8 *)((long)hal + 0xa0) = 0;
  MVar2 = (*UNRECOVERED_JUMPTABLE)(hal,cfg);
  return MVar2;
}

Assistant:

static MPP_RET hal_vp8d_init(void *hal, MppHalCfg *cfg)
{
    VP8DHalContext_t *self = (VP8DHalContext_t *)hal;
    MppHalApi *p_api = NULL;
    VpuHwMode hw_mode = MODE_NULL;
    RK_U32 hw_flag = 0;

    if (NULL == self)
        return MPP_ERR_VALUE;

    mpp_env_get_u32("hal_vp8d_debug", &hal_vp8d_debug, 0);

    memset(self, 0, sizeof(VP8DHalContext_t));
    p_api = &self->hal_api;

    hw_flag = mpp_get_vcodec_type();
    if (hw_flag & HAVE_VDPU1)
        hw_mode = VDPU1_MODE;
    if (hw_flag & HAVE_VDPU2)
        hw_mode = VDPU2_MODE;

    switch (hw_mode) {
    case VDPU2_MODE:
        p_api->init = hal_vp8d_vdpu2_init;
        p_api->deinit = hal_vp8d_vdpu2_deinit;
        p_api->reg_gen = hal_vp8d_vdpu2_gen_regs;
        p_api->start = hal_vp8d_vdpu2_start;
        p_api->wait = hal_vp8d_vdpu2_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    case VDPU1_MODE:
        p_api->init = hal_vp8d_vdpu1_init;
        p_api->deinit = hal_vp8d_vdpu1_deinit;
        p_api->reg_gen = hal_vp8d_vdpu1_gen_regs;
        p_api->start = hal_vp8d_vdpu1_start;
        p_api->wait = hal_vp8d_vdpu1_wait;
        p_api->reset = NULL;
        p_api->flush = NULL;
        p_api->control = NULL;
        break;
    default:
        return MPP_ERR_INIT;
        break;
    }

    return p_api->init (hal, cfg);
}